

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsNonSemanticInstruction(Instruction *this)

{
  uint32_t id;
  DefUseManager *this_00;
  Instruction *this_01;
  Operand *this_02;
  long lVar1;
  bool bVar2;
  string import_name;
  string local_30;
  
  bVar2 = false;
  if ((this->has_result_id_ == true) && (bVar2 = false, this->opcode_ == OpExtInst)) {
    this_00 = IRContext::get_def_use_mgr(this->context_);
    id = GetSingleWordInOperand(this,0);
    this_01 = analysis::DefUseManager::GetDef(this_00,id);
    this_02 = GetInOperand(this_01,0);
    Operand::AsString_abi_cxx11_(&local_30,this_02);
    lVar1 = std::__cxx11::string::find((char *)&local_30,0x2be1bc);
    bVar2 = lVar1 == 0;
    std::__cxx11::string::_M_dispose();
  }
  return bVar2;
}

Assistant:

bool Instruction::IsNonSemanticInstruction() const {
  if (!HasResultId()) return false;
  if (opcode() != spv::Op::OpExtInst) return false;

  auto import_inst =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(0));
  std::string import_name = import_inst->GetInOperand(0).AsString();
  return import_name.find("NonSemantic.") == 0;
}